

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::get_changes_in_range<Patch::OldCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  initializer_list<Patch::PositionStackEntry> __l;
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  uint32_t uVar10;
  reference pvVar11;
  Point PVar12;
  Point PVar13;
  Point PVar14;
  pointer pTVar15;
  reference ppNVar16;
  PositionStackEntry local_1d8;
  undefined1 local_1c0 [8];
  Change change;
  uint32_t preceding_new_text_size;
  uint32_t preceding_old_text_size;
  uint32_t old_text_size;
  Text *new_text;
  Text *old_text;
  Point new_end;
  Point old_end;
  Point local_140;
  Point node_start;
  Point new_start;
  Point old_start;
  PositionStackEntry *left_ancestor_info_1;
  PositionStackEntry local_110;
  Point local_f8;
  Point local_f0;
  Point local_e8;
  Point node_end;
  Point node_new_end;
  Point node_old_end;
  Point node_new_start;
  Point node_old_start;
  value_type *left_ancestor_info;
  size_t found_node_left_ancestor_count;
  size_t found_node_ancestor_count;
  Node *found_node;
  PositionStackEntry local_90;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> left_ancestor_stack;
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> node_stack;
  Node *node;
  bool inclusive_local;
  Patch *this_local;
  Point end_local;
  Point start_local;
  vector<Patch::Change,_std::allocator<Patch::Change>_> *result;
  
  this_local = (Patch *)end;
  end_local = start;
  std::vector<Patch::Change,_std::allocator<Patch::Change>_>::vector(__return_storage_ptr__);
  node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &this->root->left;
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::vector
            ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
             &left_ancestor_stack.
              super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PositionStackEntry::PositionStackEntry(&local_90);
  local_78 = &local_90;
  local_70 = 1;
  std::allocator<Patch::PositionStackEntry>::allocator
            ((allocator<Patch::PositionStackEntry> *)((long)&found_node + 3));
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::vector
            ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
             local_68,__l,(allocator<Patch::PositionStackEntry> *)((long)&found_node + 3));
  std::allocator<Patch::PositionStackEntry>::~allocator
            ((allocator<Patch::PositionStackEntry> *)((long)&found_node + 3));
  found_node_ancestor_count = 0;
  found_node_left_ancestor_count = 0;
  left_ancestor_info = (value_type *)0x0;
  while (node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    pvVar11 = std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
              back((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
                   local_68);
    node_new_start =
         Point::traverse(&pvVar11->old_end,
                         (Point *)(node_stack.
                                   super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    node_old_end = Point::traverse(&pvVar11->new_end,
                                   (Point *)(node_stack.
                                             super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 5)
                                  );
    PVar12 = Point::traverse(&node_new_start,
                             (Point *)(node_stack.
                                       super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    local_f8 = Point::traverse(&node_old_end,
                               (Point *)(node_stack.
                                         super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    local_f0 = PVar12;
    node_end = local_f8;
    local_e8 = OldCoordinates::choose(PVar12,local_f8);
    bVar2 = Point::operator>(&local_e8,&end_local);
    if ((bVar2) || ((inclusive && (bVar2 = Point::operator==(&local_e8,&end_local), bVar2)))) {
      found_node_left_ancestor_count =
           std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::size
                     ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                      &left_ancestor_stack.
                       super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      left_ancestor_info =
           (value_type *)
           std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::size
                     ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                       *)local_68);
      found_node_ancestor_count =
           (size_t)node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (*node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage == (Node *)0x0) break;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                 &left_ancestor_stack.
                  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &(*node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)->left;
    }
    else {
      PVar13 = node_end;
      if (node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[1] == (Node *)0x0) break;
      uVar10 = pvVar11->total_old_text_size;
      uVar4 = Node::left_subtree_old_text_size
                        ((Node *)node_stack.
                                 super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar5 = Node::old_text_size((Node *)node_stack.
                                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar8 = pvVar11->total_new_text_size;
      uVar6 = Node::left_subtree_new_text_size
                        ((Node *)node_stack.
                                 super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar7 = Node::new_text_size((Node *)node_stack.
                                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PositionStackEntry::PositionStackEntry
                (&local_110,PVar12,PVar13,uVar10 + uVar4 + uVar5,uVar8 + uVar6 + uVar7);
      std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::push_back
                ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
                 local_68,&local_110);
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                 &left_ancestor_stack.
                  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           &node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[1]->left;
    }
  }
  node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)found_node_ancestor_count;
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize
            ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
             &left_ancestor_stack.
              super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,found_node_left_ancestor_count);
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::resize
            ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
             local_68,(size_type)left_ancestor_info);
  while (node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    pvVar11 = std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
              back((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
                   local_68);
    new_start = Point::traverse(&pvVar11->old_end,
                                (Point *)(node_stack.
                                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    node_start = Point::traverse(&pvVar11->new_end,
                                 (Point *)(node_stack.
                                           super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
    local_140 = OldCoordinates::choose(new_start,node_start);
    bVar2 = Point::operator>(&local_140,(Point *)&this_local);
    if ((bVar2) ||
       ((!inclusive && (bVar2 = Point::operator==(&local_140,(Point *)&this_local), bVar2)))) break;
    PVar12 = Point::traverse(&new_start,
                             (Point *)(node_stack.
                                       super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    PVar13 = Point::traverse(&node_start,
                             (Point *)(node_stack.
                                       super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    PVar14 = (Point)std::unique_ptr<Text,_std::default_delete<Text>_>::get
                              ((unique_ptr<Text,_std::default_delete<Text>_> *)
                               (node_stack.
                                super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
    pTVar15 = std::unique_ptr<Text,_std::default_delete<Text>_>::get
                        ((unique_ptr<Text,_std::default_delete<Text>_> *)
                         (node_stack.
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7));
    uVar8 = Node::old_text_size((Node *)node_stack.
                                        super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar10 = pvVar11->total_old_text_size;
    uVar4 = Node::left_subtree_old_text_size
                      ((Node *)node_stack.
                               super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar9 = uVar10 + uVar4;
    uVar10 = pvVar11->total_new_text_size;
    uVar4 = Node::left_subtree_new_text_size
                      ((Node *)node_stack.
                               super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
    change.new_text._4_4_ = uVar10 + uVar4;
    local_1c0._0_4_ = new_start.row;
    local_1c0._4_4_ = new_start.column;
    change.old_end = node_start;
    change.old_start = PVar12;
    change.new_start = PVar13;
    change.new_end = PVar14;
    change.old_text = pTVar15;
    change.new_text._0_4_ = iVar9;
    change.preceding_old_text_size = uVar8;
    change._60_4_ = change.new_text._4_4_;
    std::vector<Patch::Change,_std::allocator<Patch::Change>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1c0);
    if (node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[1] == (Node *)0x0) {
      while( true ) {
        bVar3 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::empty
                          ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                           &left_ancestor_stack.
                            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar2 = false;
        if (!bVar3) {
          ppNVar16 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                               ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                                &left_ancestor_stack.
                                 super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = (*ppNVar16)->right ==
                  (Node *)node_stack.
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
        }
        if (!bVar2) break;
        ppNVar16 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                             ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                              &left_ancestor_stack.
                               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = &(*ppNVar16)->left;
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::pop_back
                  ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                   &left_ancestor_stack.
                    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::pop_back
                  ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
                   local_68);
      }
      bVar2 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::empty
                        ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                         &left_ancestor_stack.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        ppNVar16 = std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::back
                             ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                              &left_ancestor_stack.
                               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = &(*ppNVar16)->left;
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::pop_back
                  ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                   &left_ancestor_stack.
                    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else {
      uVar10 = Node::old_text_size((Node *)node_stack.
                                           super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar1 = change._60_4_;
      uVar8 = Node::new_text_size((Node *)node_stack.
                                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      PositionStackEntry::PositionStackEntry(&local_1d8,PVar12,PVar13,iVar9 + uVar10,uVar1 + uVar8);
      std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::push_back
                ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
                 local_68,&local_1d8);
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                 &left_ancestor_stack.
                  super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)
                 &node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      for (node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage =
                &node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage[1]->left;
          *node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage != (Node *)0x0;
          node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               &(*node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->left) {
        std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                  ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
                   &left_ancestor_stack.
                    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type *)
                   &node_stack.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::~vector
            ((vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> *)
             local_68);
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::~vector
            ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)
             &left_ancestor_stack.
              super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

vector<Patch::Change> Patch::get_changes_in_range(Point start, Point end, bool inclusive) const {
  vector<Change> result;

  Node *node = root;
  vector<Node *> node_stack;
  vector<Patch::PositionStackEntry> left_ancestor_stack{{}};

  Node *found_node = nullptr;
  size_t found_node_ancestor_count = 0;
  size_t found_node_left_ancestor_count = 0;

  while (node) {
    auto &left_ancestor_info = left_ancestor_stack.back();
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(node->old_extent);
    Point node_new_end = node_new_start.traverse(node->new_extent);

    Point node_end = CoordinateSpace::choose(node_old_end, node_new_end);
    if (node_end > start || (inclusive && node_end == start)) {
      found_node_ancestor_count = node_stack.size();
      found_node_left_ancestor_count = left_ancestor_stack.size();
      found_node = node;
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    } else {
      if (node->right) {
        left_ancestor_stack.push_back({
          node_old_end,
          node_new_end,
          left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size() + node->old_text_size(),
          left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size() + node->new_text_size()
        });
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    }
  }

  node = found_node;
  node_stack.resize(found_node_ancestor_count);
  left_ancestor_stack.resize(found_node_left_ancestor_count);

  while (node) {
    PositionStackEntry &left_ancestor_info = left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);
    Point node_start = CoordinateSpace::choose(old_start, new_start);
    if (node_start > end || (!inclusive && node_start == end)) break;

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };
    result.push_back(change);

    if (node->right) {
      left_ancestor_stack.push_back(PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}